

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

string * __thiscall
json::Integer::stringify_abi_cxx11_(string *__return_storage_ptr__,Integer *this)

{
  stringstream stream;
  stringstream asStack_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::ostream::_M_insert<long>((long)local_188);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string stringify() const {
            std::stringstream stream;
            stream << value;
            return stream.str();
        }